

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterCommon.h
# Opt level: O3

void __thiscall PixelToaster::DisplayAdapter::defaults(DisplayAdapter *this)

{
  this->_title[0] = '\0';
  this->_width = 0;
  this->_height = 0;
  this->_mode = FloatingPoint;
  this->_output = Default;
  this->_open = false;
  return;
}

Assistant:

virtual void defaults()
    {
        _title[0] = 0;
        _width    = 0;
        _height   = 0;
        _mode     = Mode::FloatingPoint;
        _output   = Output::Default;
        _open     = false;
    }